

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O2

string * __thiscall
duckdb::CastExceptionText<duckdb::string_t,double>
          (string *__return_storage_ptr__,duckdb *this,string_t input)

{
  string_t input_00;
  PhysicalType type;
  undefined8 in_stack_ffffffffffffff68;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  input_00.value.pointer.ptr = (char *)in_stack_ffffffffffffff68;
  input_00.value._0_8_ = 0x13bd412;
  ConvertToString::Operation<duckdb::string_t>(input_00);
  ::std::operator+(&local_70,"Could not convert string \'",&local_30);
  ::std::operator+(&local_50,&local_70,"\' to ");
  TypeIdToString_abi_cxx11_(&local_90,(duckdb *)0xc,type);
  ::std::operator+(__return_storage_ptr__,&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

static string CastExceptionText(SRC input) {
	if (std::is_same<SRC, string_t>()) {
		return "Could not convert string '" + ConvertToString::Operation<SRC>(input) + "' to " +
		       TypeIdToString(GetTypeId<DST>());
	}
	if (TypeIsNumber<SRC>() && TypeIsNumber<DST>()) {
		return "Type " + TypeIdToString(GetTypeId<SRC>()) + " with value " + ConvertToString::Operation<SRC>(input) +
		       " can't be cast because the value is out of range for the destination type " +
		       TypeIdToString(GetTypeId<DST>());
	}
	return "Type " + TypeIdToString(GetTypeId<SRC>()) + " with value " + ConvertToString::Operation<SRC>(input) +
	       " can't be cast to the destination type " + TypeIdToString(GetTypeId<DST>());
}